

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_strategy.cpp
# Opt level: O3

vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_> *
license::hw_identifier::available_strategies(void)

{
  bool bVar1;
  LCC_API_VIRTUALIZATION_SUMMARY LVar2;
  vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
  *extraout_RAX;
  undefined8 *in_RDI;
  ExecutionEnvironment exec;
  ExecutionEnvironment local_f0;
  
  os::ExecutionEnvironment::ExecutionEnvironment(&local_f0);
  LVar2 = os::ExecutionEnvironment::virtualization(&local_f0);
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  if (LVar2 == VM) {
    bVar1 = os::ExecutionEnvironment::is_cloud(&local_f0);
    if (bVar1) {
      std::
      vector<LCC_API_HW_IDENTIFICATION_STRATEGY,std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>>
      ::_M_assign_aux<LCC_API_HW_IDENTIFICATION_STRATEGY_const*>();
    }
    else {
      std::
      vector<LCC_API_HW_IDENTIFICATION_STRATEGY,std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>>
      ::_M_assign_aux<LCC_API_HW_IDENTIFICATION_STRATEGY_const*>();
    }
  }
  else if (LVar2 == CONTAINER) {
    if (local_f0.m_container_type == DOCKER) {
      std::
      vector<LCC_API_HW_IDENTIFICATION_STRATEGY,std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>>
      ::_M_assign_aux<LCC_API_HW_IDENTIFICATION_STRATEGY_const*>();
    }
    else {
      std::
      vector<LCC_API_HW_IDENTIFICATION_STRATEGY,std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>>
      ::_M_assign_aux<LCC_API_HW_IDENTIFICATION_STRATEGY_const*>();
    }
  }
  else {
    std::
    vector<LCC_API_HW_IDENTIFICATION_STRATEGY,std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>>::
    _M_assign_aux<LCC_API_HW_IDENTIFICATION_STRATEGY_const*>();
  }
  os::DmiInfo::~DmiInfo(&local_f0.m_dmi_info);
  os::CpuInfo::~CpuInfo(&local_f0.m_cpu_info);
  return extraout_RAX;
}

Assistant:

static vector<LCC_API_HW_IDENTIFICATION_STRATEGY> available_strategies() {
	const os::ExecutionEnvironment exec;
	LCC_API_VIRTUALIZATION_SUMMARY virtualization = exec.virtualization();
	vector<LCC_API_HW_IDENTIFICATION_STRATEGY> strategy_to_try;
	if (virtualization == LCC_API_VIRTUALIZATION_SUMMARY::CONTAINER) {
		if (exec.is_docker()) {
			strategy_to_try = LCC_DOCKER_STRATEGIES;
		} else {
			strategy_to_try = LCC_LXC_STRATEGIES;
		}
	} else if (virtualization == LCC_API_VIRTUALIZATION_SUMMARY::VM) {
		if (exec.is_cloud()) {
			strategy_to_try = LCC_CLOUD_STRATEGIES;
		} else {
			strategy_to_try = LCC_VM_STRATEGIES;
		}
	} else {
		strategy_to_try = LCC_BARE_TO_METAL_STRATEGIES;
	}
	return strategy_to_try;
}